

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__decode_half_float_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 (*pauVar6) [16];
  short *psVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  undefined2 uVar19;
  undefined2 uVar20;
  int iVar21;
  ushort uVar22;
  int iVar23;
  undefined2 uVar24;
  undefined2 uVar25;
  undefined2 uVar27;
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar5 = _DAT_005ecc00;
  auVar4 = _DAT_005ce310;
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    pfVar8 = decodep;
    if (3 < width_times_channels) {
      do {
        decodep = pfVar8 + 4;
        fVar10 = (float)(((int)*(short *)((long)inputp + 2) & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        *pfVar8 = (float)((int)*(short *)((long)inputp + 2) & 0x80000000U | (uint)fVar2);
        fVar10 = (float)(((int)*inputp & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        pfVar8[1] = (float)((int)*inputp & 0x80000000U | (uint)fVar2);
        fVar10 = (float)(((int)*(short *)((long)inputp + 6) & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        pfVar8[2] = (float)((int)*(short *)((long)inputp + 6) & 0x80000000U | (uint)fVar2);
        fVar10 = (float)(((int)*(short *)((long)inputp + 4) & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        pfVar8[3] = (float)((int)*(short *)((long)inputp + 4) & 0x80000000U | (uint)fVar2);
        inputp = (void *)((long)inputp + 8);
        pfVar9 = pfVar8 + 8;
        pfVar8 = decodep;
      } while (pfVar9 <= pfVar1);
    }
    if (decodep < pfVar1) {
      psVar7 = (short *)((long)inputp + 2);
      do {
        fVar10 = (float)(((int)*psVar7 & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        *decodep = (float)((int)*psVar7 & 0x80000000U | (uint)fVar2);
        fVar10 = (float)(((int)psVar7[-1] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar10 | 0x7f800000);
        if (fVar10 < 65536.0) {
          fVar2 = fVar10;
        }
        decodep[1] = (float)((int)psVar7[-1] & 0x80000000U | (uint)fVar2);
        decodep = decodep + 2;
        psVar7 = psVar7 + 2;
      } while (decodep < pfVar1);
    }
  }
  else {
    pauVar6 = (undefined1 (*) [16])inputp;
    do {
      do {
        auVar17 = *pauVar6;
        uVar20 = auVar17._4_2_;
        auVar3._10_2_ = uVar20;
        auVar3._0_10_ = (unkuint10)0;
        uVar19 = auVar17._2_2_;
        auVar29._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar3._8_4_,uVar19)) << 0x30,4);
        auVar29._0_2_ = auVar17._0_2_;
        auVar29._14_2_ = 0;
        uVar22 = auVar17._8_2_;
        uVar24 = auVar17._10_2_;
        auVar28._0_10_ = (unkuint10)CONCAT24(uVar24,(uint)uVar22) << 0x10;
        uVar25 = auVar17._12_2_;
        auVar28._10_2_ = uVar25;
        auVar28._12_2_ = 0;
        uVar27 = auVar17._14_2_;
        auVar28._14_2_ = uVar27;
        auVar16._0_12_ = auVar17._0_12_;
        auVar16._12_2_ = auVar17._6_2_;
        auVar16._14_2_ = auVar17._6_2_;
        auVar15._12_4_ = auVar16._12_4_;
        auVar15._0_10_ = auVar17._0_10_;
        auVar15._10_2_ = uVar20;
        auVar14._10_6_ = auVar15._10_6_;
        auVar14._0_8_ = auVar17._0_8_;
        auVar14._8_2_ = uVar20;
        auVar17._8_8_ = auVar14._8_8_;
        auVar17._6_2_ = uVar19;
        auVar17._4_2_ = uVar19;
        auVar17._2_2_ = auVar17._0_2_;
        auVar17 = auVar17 & auVar5;
        iVar13 = auVar17._0_4_;
        iVar21 = auVar17._4_4_;
        iVar23 = auVar17._8_4_;
        iVar26 = auVar17._12_4_;
        auVar18._0_4_ = iVar13 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar13) & 0x38000000);
        auVar18._4_4_ = iVar21 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar21) & 0x38000000);
        auVar18._8_4_ = iVar23 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar23) & 0x38000000);
        auVar18._12_4_ = iVar26 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar26) & 0x38000000);
        auVar31._0_4_ = -(uint)(0x3ff < iVar13);
        auVar31._4_4_ = -(uint)(0x3ff < iVar21);
        auVar31._8_4_ = -(uint)(0x3ff < iVar23);
        auVar31._12_4_ = -(uint)(0x3ff < iVar26);
        auVar33._0_4_ = (float)(iVar13 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._4_4_ = (float)(iVar21 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._8_4_ = (float)(iVar23 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._12_4_ = (float)(iVar26 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar17 = auVar29 << 0x10 & auVar4 | auVar18 & auVar31 | ~auVar31 & auVar33;
        auVar11._2_2_ = uVar22;
        auVar11._0_2_ = uVar22;
        auVar11._4_2_ = uVar24;
        auVar11._6_2_ = uVar24;
        auVar11._8_2_ = uVar25;
        auVar11._10_2_ = uVar25;
        auVar11._12_2_ = uVar27;
        auVar11._14_2_ = uVar27;
        auVar11 = auVar11 & auVar5;
        iVar13 = auVar11._0_4_;
        iVar21 = auVar11._4_4_;
        iVar23 = auVar11._8_4_;
        iVar26 = auVar11._12_4_;
        auVar30._0_4_ = -(uint)(0x3ff < iVar13);
        auVar30._4_4_ = -(uint)(0x3ff < iVar21);
        auVar30._8_4_ = -(uint)(0x3ff < iVar23);
        auVar30._12_4_ = -(uint)(0x3ff < iVar26);
        auVar12._0_4_ = iVar13 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar13) & 0x38000000);
        auVar12._4_4_ = iVar21 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar21) & 0x38000000);
        auVar12._8_4_ = iVar23 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar23) & 0x38000000);
        auVar12._12_4_ = iVar26 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar26) & 0x38000000);
        auVar32._0_4_ = (float)(iVar13 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._4_4_ = (float)(iVar21 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._8_4_ = (float)(iVar23 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._12_4_ = (float)(iVar26 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar29 = auVar28 & auVar4 | auVar12 & auVar30 | ~auVar30 & auVar32;
        *decodep = auVar17._4_4_;
        decodep[1] = auVar17._0_4_;
        decodep[2] = auVar17._12_4_;
        decodep[3] = auVar17._8_4_;
        decodep[4] = auVar29._4_4_;
        decodep[5] = auVar29._0_4_;
        decodep[6] = auVar29._12_4_;
        decodep[7] = auVar29._8_4_;
        pfVar8 = decodep + 8;
        pauVar6 = pauVar6 + 1;
        decodep = pfVar8;
      } while (pfVar8 <= pfVar1 + -8);
      pauVar6 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
      decodep = pfVar1 + -8;
    } while (pfVar8 != pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_half_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  stbir__FP16 const * input = (stbir__FP16 const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    stbir__FP16 const * end_input_m8 = input + width_times_channels - 8;
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);

      stbir__half_to_float_SIMD( decode, input );
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, decode );
        stbir__decode_simdf8_flip( of );
        stbir__simdf8_store( decode, of );
      }
      #else
      {
        stbir__simdf of0,of1;
        stbir__simdf_load( of0, decode );
        stbir__simdf_load( of1, decode+4 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
      }
      #endif
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = stbir__half_to_float(input[stbir__decode_order0]);
    decode[1-4] = stbir__half_to_float(input[stbir__decode_order1]);
    decode[2-4] = stbir__half_to_float(input[stbir__decode_order2]);
    decode[3-4] = stbir__half_to_float(input[stbir__decode_order3]);
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__half_to_float(input[stbir__decode_order0]);
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__half_to_float(input[stbir__decode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__half_to_float(input[stbir__decode_order2]);
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}